

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendUnit.cpp
# Opt level: O1

ServerSegment * __thiscall SendUnit::getRUDP(SendUnit *this,byte4 seqNo)

{
  byte *data;
  ServerSegment *this_00;
  size_t __n;
  ulong uVar1;
  
  data = (byte *)calloc(0x5b0,1);
  memset(data,0,0x5b0);
  uVar1 = (ulong)(seqNo - this->initSeqNo);
  __n = this->dataSize - uVar1;
  if (__n < 0x5b0) {
    memcpy(data,this->data + uVar1,__n);
    this_00 = (ServerSegment *)operator_new(0x18);
    ServerSegment::ServerSegment(this_00,seqNo,'Y',data,0,'N',0,0);
  }
  else {
    memcpy(data,this->data + uVar1,0x5b0);
    this_00 = (ServerSegment *)operator_new(0x18);
    ServerSegment::ServerSegment(this_00,seqNo,'N',data,0,'N',0,0);
  }
  return this_00;
}

Assistant:

ServerSegment *SendUnit::getRUDP(byte4 seqNo) {
    byte *dataSpace = (byte *) calloc(MTU - HEADER_LEN, sizeof(byte)); //分配数据可用连续空间
    memset(dataSpace, 0, (MTU - HEADER_LEN)); // 初始化数据置临零
    // 如果剩下的数据小于单次最大传输容量，则读取所有剩余数据，将结束位置为 TRUE 后发送，否则读取单次最大传输容量数据，将结束位置 FALSE 后发送。
    if (dataSize - (seqNo - initSeqNo) < MTU - HEADER_LEN) {
        memcpy(dataSpace, &data[(seqNo-initSeqNo)], dataSize - (seqNo - initSeqNo));
        return new ServerSegment(seqNo, TRUE, dataSpace);
    } else {
        memcpy(dataSpace, &data[(seqNo-initSeqNo)], (MTU - HEADER_LEN));
        return new ServerSegment(seqNo, FALSE, dataSpace);
    }
}